

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::value::StringData>::
initialize<tinyusdz::value::StringData>
          (optional<tinyusdz::value::StringData> *this,StringData *value)

{
  if (this->has_value_ != true) {
    tinyusdz::value::StringData::StringData((StringData *)&this->contained,value);
    this->has_value_ = true;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::value::StringData>::initialize(V &&) [T = tinyusdz::value::StringData, V = tinyusdz::value::StringData]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }